

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_lightbuffer.cpp
# Opt level: O1

int __thiscall FLightBuffer::UploadLights(FLightBuffer *this,FDynLightData *data)

{
  int iVar1;
  float *pfVar2;
  uint uVar3;
  _func_void_GLenum_GLsizeiptr_void_ptr_GLenum **pp_Var4;
  float *pfVar5;
  uint uVar6;
  GLenum GVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  GLbitfield GVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  uint newbuffer;
  GLuint local_44;
  FDynLightData *local_40;
  ulong local_38;
  
  uVar13 = data->arrays[0].Count >> 2;
  uVar14 = data->arrays[1].Count >> 2;
  uVar9 = data->arrays[2].Count >> 2;
  uVar11 = uVar9 + uVar14 + uVar13 + 1;
  local_38 = (ulong)uVar11;
  uVar10 = this->mBlockAlign;
  if (uVar10 != 0) {
    uVar3 = this->mBlockSize;
    if ((uVar3 < this->mIndex % uVar10 + uVar11) &&
       (uVar6 = this->mIndex + uVar10, this->mIndex = uVar6 - uVar6 % uVar10,
       uVar3 <= uVar14 + uVar13 + uVar9)) {
      uVar10 = (uVar3 - uVar11) + uVar9;
      uVar9 = 0;
      if (0 < (int)uVar10) {
        uVar9 = uVar10;
      }
      if (-1 < (int)uVar10) {
        uVar10 = 0;
      }
      uVar10 = uVar10 + uVar14;
      uVar14 = 0;
      if (0 < (int)uVar10) {
        uVar14 = uVar10;
      }
      if (-1 < (int)uVar10) {
        uVar10 = 0;
      }
      uVar13 = uVar10 + uVar13;
      local_38 = (ulong)(uVar9 + uVar14 + uVar13 + 1);
    }
  }
  uVar10 = 0xffffffff;
  if (1 < (int)local_38) {
    if (this->mBufferSize >> 2 < this->mIndex + (int)local_38) {
      local_40 = data;
      (*_ptrc_glBindBuffer)(this->mBufferType,this->mBufferId);
      (*_ptrc_glUnmapBuffer)(this->mBufferType);
      (*_ptrc_glGenBuffers)(1,&local_44);
      (*_ptrc_glBindBufferBase)(this->mBufferType,1,local_44);
      (*_ptrc_glBindBuffer)(this->mBufferType,local_44);
      (*_ptrc_glBindBuffer)(0x8f36,this->mBufferId);
      this->mBufferSize = this->mBufferSize << 1;
      uVar10 = this->mByteSize * 2;
      this->mByteSize = uVar10;
      bVar15 = gl.lightmethod == 2;
      GVar7 = 0x88e8;
      if (bVar15) {
        GVar7 = 0xc2;
      }
      GVar12 = 10;
      if (bVar15) {
        GVar12 = 0xc2;
      }
      pp_Var4 = &_ptrc_glBufferData;
      if (bVar15) {
        pp_Var4 = (_func_void_GLenum_GLsizeiptr_void_ptr_GLenum **)&_ptrc_glBufferStorage;
      }
      (**pp_Var4)(this->mBufferType,(GLsizeiptr)uVar10,(void *)0x0,GVar7);
      pfVar5 = (float *)(*_ptrc_glMapBufferRange)
                                  (this->mBufferType,0,(GLsizeiptr)this->mByteSize,GVar12);
      this->mBufferPointer = pfVar5;
      (*_ptrc_glCopyBufferSubData)(0x8f36,this->mBufferType,0,0,0);
      (*_ptrc_glBindBuffer)(0x8f36,0);
      (*_ptrc_glDeleteBuffers)(1,&this->mBufferId);
      this->mBufferId = local_44;
      data = local_40;
    }
    pfVar5 = this->mBufferPointer;
    if (pfVar5 == (float *)0x0) {
      __assert_fail("mBufferPointer != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/gl/dynlights/gl_lightbuffer.cpp"
                    ,0xae,"int FLightBuffer::UploadLights(FDynLightData &)");
    }
    uVar8 = (ulong)(this->mIndex << 2);
    pfVar2 = pfVar5 + uVar8;
    iVar1 = uVar13 + uVar14;
    *pfVar2 = 0.0;
    pfVar2[1] = (float)(int)uVar13;
    pfVar2[2] = (float)iVar1;
    pfVar2[3] = (float)(int)(iVar1 + uVar9);
    memcpy(pfVar5 + uVar8 + 4,data->arrays[0].Array,(long)(int)(uVar13 << 2) * 4);
    memcpy(pfVar2 + (long)(int)(uVar13 << 2) + 4,data->arrays[1].Array,(ulong)(uVar14 << 2) << 2);
    memcpy(pfVar2 + (long)(iVar1 * 4) + 4,data->arrays[2].Array,(ulong)(uVar9 << 2) << 2);
    uVar10 = this->mIndex;
    this->mIndex = uVar10 + (int)local_38;
    draw_dlight = draw_dlight + ((int)local_38 - 1U >> 1);
  }
  return uVar10;
}

Assistant:

int FLightBuffer::UploadLights(FDynLightData &data)
{
	int size0 = data.arrays[0].Size()/4;
	int size1 = data.arrays[1].Size()/4;
	int size2 = data.arrays[2].Size()/4;
	int totalsize = size0 + size1 + size2 + 1;

	// pointless type casting because some compilers can't print enough warnings.
	if (mBlockAlign > 0 && (unsigned int)totalsize + (mIndex % mBlockAlign) > mBlockSize)
	{
		mIndex = ((mIndex + mBlockAlign) / mBlockAlign) * mBlockAlign;

		// can't be rendered all at once.
		if ((unsigned int)totalsize > mBlockSize)
		{
			int diff = totalsize - (int)mBlockSize;

			size2 -= diff;
			if (size2 < 0)
			{
				size1 += size2;
				size2 = 0;
			}
			if (size1 < 0)
			{
				size0 += size1;
				size1 = 0;
			}
			totalsize = size0 + size1 + size2 + 1;
		}
	}

	if (totalsize <= 1) return -1;

	if (mIndex + totalsize > mBufferSize/4)
	{
		// reallocate the buffer with twice the size
		unsigned int newbuffer;

		// first unmap the old buffer
		glBindBuffer(mBufferType, mBufferId);
		glUnmapBuffer(mBufferType);

		// create and bind the new buffer, bind the old one to a copy target (too bad that DSA is not yet supported well enough to omit this crap.)
		glGenBuffers(1, &newbuffer);
		glBindBufferBase(mBufferType, LIGHTBUF_BINDINGPOINT, newbuffer);
		glBindBuffer(mBufferType, newbuffer);	// Note: Some older AMD drivers don't do that in glBindBufferBase, as they should.
		glBindBuffer(GL_COPY_READ_BUFFER, mBufferId);

		// create the new buffer's storage (twice as large as the old one)
		mBufferSize *= 2;
		mByteSize *= 2;
		if (gl.lightmethod == LM_DIRECT)
		{
			glBufferStorage(mBufferType, mByteSize, NULL, GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT);
			mBufferPointer = (float*)glMapBufferRange(mBufferType, 0, mByteSize, GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT);
		}
		else
		{
			glBufferData(mBufferType, mByteSize, NULL, GL_DYNAMIC_DRAW);
			mBufferPointer = (float*)glMapBufferRange(mBufferType, 0, mByteSize, GL_MAP_WRITE_BIT|GL_MAP_INVALIDATE_BUFFER_BIT);
		}

		// copy contents and delete the old buffer.
		glCopyBufferSubData(GL_COPY_READ_BUFFER, mBufferType, 0, 0, mByteSize/2);
		glBindBuffer(GL_COPY_READ_BUFFER, 0);
		glDeleteBuffers(1, &mBufferId);
		mBufferId = newbuffer;
	}

	float *copyptr;
	
	assert(mBufferPointer != NULL);
	if (mBufferPointer == NULL) return -1;
	copyptr = mBufferPointer + mIndex * 4;

	float parmcnt[] = { 0, float(size0), float(size0 + size1), float(size0 + size1 + size2) };

	memcpy(&copyptr[0], parmcnt, 4 * sizeof(float));
	memcpy(&copyptr[4], &data.arrays[0][0], 4 * size0*sizeof(float));
	memcpy(&copyptr[4 + 4*size0], &data.arrays[1][0], 4 * size1*sizeof(float));
	memcpy(&copyptr[4 + 4*(size0 + size1)], &data.arrays[2][0], 4 * size2*sizeof(float));

	unsigned int bufferindex = mIndex;
	mIndex += totalsize;
	draw_dlight += (totalsize-1) / 2;
	return bufferindex;
}